

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O1

bool spvtools::opt::anon_unknown_0::CompositeExtractFeedingConstruct
               (IRContext *context,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  OperandList *this;
  DefUseManager *this_00;
  pointer pOVar1;
  pointer pOVar2;
  uint32_t uVar3;
  _Type acVar4;
  Instruction *pIVar5;
  array<signed_char,_4UL> id;
  uint uVar6;
  uint32_t uVar7;
  Instruction *inst_2;
  bool bVar8;
  bool bVar9;
  undefined8 local_a8;
  undefined1 auStack_a0 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_80;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  if (inst->opcode_ != OpCompositeConstruct) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeConstruct && \"Wrong opcode.  Should be OpCompositeConstruct.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x6da,
                  "bool spvtools::opt::(anonymous namespace)::CompositeExtractFeedingConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  if ((context->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(context);
  }
  uVar6 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar6 = (uint)inst->has_result_id_;
  }
  bVar8 = false;
  if (uVar6 != (int)((ulong)((long)(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
    this_00 = (context->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    uVar6 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar6 = (uint)inst->has_result_id_;
    }
    bVar9 = uVar6 == (int)((ulong)((long)(inst->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(inst->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555;
    bVar8 = !bVar9;
    if (bVar9) {
      id._M_elems[0] = '\0';
      id._M_elems[1] = '\0';
      id._M_elems[2] = '\0';
      id._M_elems[3] = '\0';
      inst_2 = (Instruction *)0x0;
    }
    else {
      id._M_elems[0] = '\0';
      id._M_elems[1] = '\0';
      id._M_elems[2] = '\0';
      id._M_elems[3] = '\0';
      inst_2 = (Instruction *)0x0;
      uVar7 = 0;
      do {
        uVar3 = Instruction::GetSingleWordOperand(inst,uVar6 + uVar7);
        pIVar5 = analysis::DefUseManager::GetDef(this_00,uVar3);
        if (inst_2 == (Instruction *)0x0) {
          inst_2 = pIVar5;
        }
        if (((pIVar5->opcode_ == OpCompositeExtract) &&
            (bVar9 = HaveSameIndexesExceptForLast(pIVar5,inst_2), bVar9)) &&
           (uVar3 = Instruction::GetSingleWordOperand
                              (pIVar5,(int)((ulong)((long)(pIVar5->operands_).
                                                                                                                    
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pIVar5->operands_).
                                                                                                                
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                      -0x55555555 - 1), uVar7 == uVar3)) {
          uVar3 = (pIVar5->has_result_id_ & 1) + 1;
          if (pIVar5->has_type_id_ == false) {
            uVar3 = (uint)pIVar5->has_result_id_;
          }
          acVar4 = (_Type)Instruction::GetSingleWordOperand(pIVar5,uVar3);
          bVar9 = id._M_elems == acVar4;
          if (uVar7 == 0) {
            id._M_elems = acVar4;
          }
          bVar9 = uVar7 == 0 || bVar9;
        }
        else {
          bVar9 = false;
        }
        if (!bVar9) break;
        uVar7 = uVar7 + 1;
        uVar6 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar6 = (uint)inst->has_result_id_;
        }
        bVar8 = uVar7 < (int)((ulong)((long)(inst->operands_).
                                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(inst->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                        -0x55555555 - uVar6;
      } while (bVar8);
    }
    if (bVar8) {
      bVar8 = false;
    }
    else {
      if (inst_2 == (Instruction *)0x0) {
        __assert_fail("first_element_inst != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                      ,0x704,
                      "bool spvtools::opt::(anonymous namespace)::CompositeExtractFeedingConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                     );
      }
      pIVar5 = analysis::DefUseManager::GetDef(this_00,(uint32_t)id._M_elems);
      uVar3 = 0;
      uVar7 = 0;
      if (pIVar5->has_type_id_ == true) {
        uVar7 = Instruction::GetSingleWordOperand(pIVar5,0);
      }
      uVar7 = GetElementType(uVar7,(inst_2->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 3,
                             (inst_2->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1,this_00);
      if (inst->has_type_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(inst,0);
      }
      bVar8 = uVar3 == uVar7;
      if (bVar8) {
        this = &inst->operands_;
        pOVar1 = (inst_2->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pOVar2 = (inst_2->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar6 = (inst_2->has_result_id_ & 1) + 1;
        if (inst_2->has_type_id_ == false) {
          uVar6 = (uint)inst_2->has_result_id_;
        }
        if ((int)((ulong)((long)pOVar2 - (long)pOVar1) >> 4) * -0x55555555 - uVar6 == 2) {
          inst->opcode_ = OpCopyObject;
          local_70._24_8_ = local_70 + 0x10;
          local_70._0_8_ = &PTR__SmallVector_00b15d78;
          local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_70._8_8_ = 1;
          local_a8 = CONCAT44(local_a8._4_4_,1);
          auStack_a0._0_8_ = &PTR__SmallVector_00b15d78;
          auStack_a0._8_8_ = 0;
          auStack_a0._24_8_ = auStack_a0 + 0x10;
          local_80._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          local_70._16_4_ = id._M_elems;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)auStack_a0,
                     (SmallVector<unsigned_int,_2UL> *)local_70);
          local_48.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_48.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
          pOVar1 = local_48.
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
          (local_48.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start)->type = (spv_operand_type_t)local_a8;
          ((local_48.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start)->words)._vptr_SmallVector =
               (_func_int **)&PTR__SmallVector_00b15d78;
          ((local_48.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start)->words).size_ = 0;
          ((local_48.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start)->words).small_data_ =
               (uint *)((local_48.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start)->words).buffer;
          ((local_48.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start)->words).large_data_._M_t.
          super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_48.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar1;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&(local_48.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words,
                     (SmallVector<unsigned_int,_2UL> *)auStack_a0);
          uVar6 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar6 = (uint)inst->has_result_id_;
          }
          local_48.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = pOVar1;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                    (this,(Operand *)
                          ((long)((((inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                                 0xfffffffffffffffa) + (ulong)(uVar6 * 0x30)),
                     (inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)this,
                     (inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     local_48.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&local_48);
          auStack_a0._0_8_ = &PTR__SmallVector_00b15d78;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )local_80._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_80,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       local_80._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl);
          }
          local_80._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          local_70._0_8_ = &PTR__SmallVector_00b15d78;
          if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
              local_50._M_head_impl !=
              (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
              0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_50,local_50._M_head_impl);
          }
        }
        else {
          inst->opcode_ = OpCompositeExtract;
          local_a8 = 0;
          auStack_a0._0_8_ = (_func_int **)0x0;
          auStack_a0._8_8_ = 0;
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          _M_range_initialize<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &local_a8,pOVar1 + 2,pOVar2 + -1);
          uVar6 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar6 = (uint)inst->has_result_id_;
          }
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                    (this,(Operand *)
                          ((long)((((inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                                 0xfffffffffffffffa) + (ulong)(uVar6 * 0x30)),
                     (inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)this,
                     (inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_a8,auStack_a0._0_8_);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     &local_a8);
        }
        bVar8 = true;
      }
    }
  }
  return bVar8;
}

Assistant:

bool CompositeExtractFeedingConstruct(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>&) {
  assert(inst->opcode() == spv::Op::OpCompositeConstruct &&
         "Wrong opcode.  Should be OpCompositeConstruct.");
  analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();
  uint32_t original_id = 0;

  if (inst->NumInOperands() == 0) {
    // The struct being constructed has no members.
    return false;
  }

  // Check each element to make sure they are:
  // - extractions
  // - extracting the same position they are inserting
  // - all extract from the same id.
  Instruction* first_element_inst = nullptr;
  for (uint32_t i = 0; i < inst->NumInOperands(); ++i) {
    const uint32_t element_id = inst->GetSingleWordInOperand(i);
    Instruction* element_inst = def_use_mgr->GetDef(element_id);
    if (first_element_inst == nullptr) {
      first_element_inst = element_inst;
    }

    if (element_inst->opcode() != spv::Op::OpCompositeExtract) {
      return false;
    }

    if (!HaveSameIndexesExceptForLast(element_inst, first_element_inst)) {
      return false;
    }

    if (element_inst->GetSingleWordInOperand(element_inst->NumInOperands() -
                                             1) != i) {
      return false;
    }

    if (i == 0) {
      original_id =
          element_inst->GetSingleWordInOperand(kExtractCompositeIdInIdx);
    } else if (original_id !=
               element_inst->GetSingleWordInOperand(kExtractCompositeIdInIdx)) {
      return false;
    }
  }
  assert(first_element_inst != nullptr);

  // The last check it to see that the object being extracted from is the
  // correct type.
  Instruction* original_inst = def_use_mgr->GetDef(original_id);
  uint32_t original_type_id =
      GetElementType(original_inst->type_id(), first_element_inst->begin() + 3,
                     first_element_inst->end() - 1, def_use_mgr);

  if (inst->type_id() != original_type_id) {
    return false;
  }

  if (first_element_inst->NumInOperands() == 2) {
    // Simplify by using the original object.
    inst->SetOpcode(spv::Op::OpCopyObject);
    inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {original_id}}});
    return true;
  }

  // Copies the original id and all indexes except for the last to the new
  // extract instruction.
  inst->SetOpcode(spv::Op::OpCompositeExtract);
  inst->SetInOperands(std::vector<Operand>(first_element_inst->begin() + 2,
                                           first_element_inst->end() - 1));
  return true;
}